

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O1

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::
WriteSparseArrayIndexProperties<Js::JavascriptArrayIndexStaticEnumerator,Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayItemAccessor>
          (SerializationCloner<Js::StreamWriter> *this,ArrayType *arr)

{
  ScriptContext *requestContext;
  uint32 index;
  BOOL BVar1;
  Engine *this_00;
  uint32 i;
  JavascriptArrayIndexStaticEnumerator local_50;
  Var local_40;
  Var value;
  uint unused;
  
  requestContext =
       (this->
       super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
       ).super_ScriptContextHolder.m_scriptContext;
  JavascriptArrayIndexStaticEnumerator::JavascriptArrayIndexStaticEnumerator(&local_50,arr);
  local_40 = (void *)0x0;
  index = JavascriptArray::GetNextIndex(local_50.m_array,local_50.m_index);
  local_50.m_index = index;
  if (index != 0xffffffff) {
    do {
      local_50.m_index = index;
      BVar1 = JavascriptOperators::GetOwnItem
                        ((RecyclableObject *)arr,index,&local_40,requestContext);
      if (BVar1 != 0) {
        value._4_4_ = index;
        StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)((long)&value + 4));
        this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                  ::GetEngine(&this->
                               super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                             );
        SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                  (this_00,local_40,(uint *)((long)&value + 4));
      }
      index = JavascriptArray::GetNextIndex(local_50.m_array,local_50.m_index);
      local_50.m_index = index;
    } while (index != 0xffffffff);
  }
  value._4_4_ = 0xffffffff;
  StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)((long)&value + 4));
  return;
}

Assistant:

void WriteSparseArrayIndexProperties(typename IndexEnumerator::ArrayType* arr)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            IndexEnumerator e(arr);
            Var value = nullptr;

            while (e.MoveNext())
            {
                uint32 i = e.GetIndex();
                if (ArrayItemAccessor::GetItem(arr, i, &value, scriptContext))
                {
                    Write(i);
                    this->GetEngine()->Clone(value);
                }
            }

            Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
        }